

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

SDKJsonResult * __thiscall
tonk::SDKSocket::Connect
          (SDKJsonResult *__return_storage_ptr__,SDKSocket *this,SDKConnection *sdkConnection,
          string *hostname,uint16_t port)

{
  TonkConnectionConfig config;
  TonkResult TVar1;
  TonkJson errorJson;
  __shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> local_450;
  SDKConnection *local_440;
  code *pcStack_438;
  code *pcStack_430;
  code *pcStack_428;
  code *local_420;
  TonkJson local_418;
  
  pcStack_438 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  pcStack_430 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  pcStack_428 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  local_420 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  config.OnConnect = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  config.AppContextPtr = sdkConnection;
  config.OnData = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  config.OnTick = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  config.OnClose = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  local_440 = sdkConnection;
  TVar1 = tonk_connect(this->MySocket,config,(hostname->_M_dataplus)._M_p,port,
                       &sdkConnection->MyConnection,&local_418);
  (__return_storage_ptr__->super_SDKResult).Result = Tonk_Success;
  (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ErrorJson).field_2;
  (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
  (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
  if (TVar1 == Tonk_Success) {
    std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tonk::SDKConnection,void>
              ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&local_450,
               (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
               &sdkConnection->super_enable_shared_from_this<tonk::SDKConnection>);
    std::__shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(sdkConnection->SelfReference).
                super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>,&local_450);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_450._M_refcount);
  }
  else {
    (__return_storage_ptr__->super_SDKResult).Result = TVar1;
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->ErrorJson);
  }
  return __return_storage_ptr__;
}

Assistant:

SDKJsonResult SDKSocket::Connect(
    SDKConnection* sdkConnection,
    const std::string& hostname, ///< [in] Hostname of the remote host
    uint16_t port ///< [in] Port for the remote host
)
{
    TonkConnectionConfig config = MakeConnectionConfig(sdkConnection);

    TonkJson errorJson;
    TonkResult result = tonk_connect(
        MySocket,
        config,
        hostname.c_str(),
        port,
        &sdkConnection->MyConnection,
        &errorJson);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = errorJson.JsonString;
    }
    else
    {
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();
    }
    return error;
}